

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# config.cc
# Opt level: O0

string * rcg::loadFile_abi_cxx11_
                   (shared_ptr<GenApi_3_4::CNodeMapRef> *nodemap,char *name,bool exception)

{
  allocator_type *paVar1;
  byte bVar2;
  int64_t iVar3;
  char *pcVar4;
  size_type sVar5;
  int *piVar6;
  invalid_argument *this;
  byte in_CL;
  _Ios_Openmode in_EDX;
  string *in_RDI;
  vector<char,_std::allocator<char>_> buffer;
  size_t n;
  size_t off;
  exception *anon_var_0;
  int length;
  int64_t *in_stack_00000100;
  FileProtocolAdapter rf;
  shared_ptr<GenApi_3_4::CNodeMapRef> *in_stack_00000110;
  string *ret;
  allocator *__rhs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffed8;
  allocator_type *in_stack_fffffffffffffee0;
  size_type in_stack_fffffffffffffee8;
  vector<char,_std::allocator<char>_> *in_stack_fffffffffffffef0;
  vector<char,_std::allocator<char>_> *this_00;
  allocator local_b9;
  string local_b8 [32];
  string local_98 [32];
  int local_78;
  allocator<char> local_71;
  vector<char,_std::allocator<char>_> local_70;
  allocator_type *local_58;
  allocator_type *local_50;
  int local_40 [4];
  FileProtocolAdapter local_30 [22];
  byte local_1a;
  byte local_19;
  _Ios_Openmode local_18;
  
  local_19 = in_CL & 1;
  local_1a = 0;
  local_18 = in_EDX;
  std::__cxx11::string::string(in_RDI);
  GenApi_3_4::FileProtocolAdapter::FileProtocolAdapter(local_30);
  std::__shared_ptr_access<GenApi_3_4::CNodeMapRef,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<GenApi_3_4::CNodeMapRef,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              *)0x131ca0);
  GenApi_3_4::FileProtocolAdapter::attach((INodeMap *)local_30);
  bVar2 = GenApi_3_4::FileProtocolAdapter::openFile((char *)local_30,local_18);
  if ((bVar2 & 1) == 0) {
    if ((local_19 & 1) != 0) {
      this = (invalid_argument *)__cxa_allocate_exception(0x10);
      __rhs = &local_b9;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_b8,"Cannot open file for reading: ",__rhs);
      std::operator+(in_stack_fffffffffffffed8,(char *)__rhs);
      std::invalid_argument::invalid_argument(this,local_98);
      __cxa_throw(this,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
    }
  }
  else {
    local_40[0] = std::numeric_limits<int>::max();
    iVar3 = getInteger(in_stack_00000110,_rf,in_stack_00000100,_length,anon_var_0._7_1_,
                       anon_var_0._6_1_);
    local_40[0] = (int)iVar3;
    local_50 = (allocator_type *)0x0;
    local_58 = (allocator_type *)0x200;
    std::allocator<char>::allocator();
    std::vector<char,_std::allocator<char>_>::vector
              (in_stack_fffffffffffffef0,in_stack_fffffffffffffee8,in_stack_fffffffffffffee0);
    std::allocator<char>::~allocator(&local_71);
    for (; local_58 != (allocator_type *)0x0 && 0 < local_40[0];
        local_40[0] = local_40[0] - (int)local_58) {
      this_00 = &local_70;
      pcVar4 = std::vector<char,_std::allocator<char>_>::data
                         ((vector<char,_std::allocator<char>_> *)0x131e2b);
      paVar1 = local_50;
      sVar5 = std::vector<char,_std::allocator<char>_>::size(this_00);
      local_78 = (int)sVar5;
      piVar6 = std::min<int>(local_40,&local_78);
      local_58 = (allocator_type *)
                 GenApi_3_4::FileProtocolAdapter::read
                           ((char *)local_30,(long)pcVar4,(long)paVar1,(char *)(long)*piVar6);
      if ((local_58 == (allocator_type *)0x0) &&
         (in_stack_fffffffffffffee0 =
               (allocator_type *)
               getInteger(in_stack_00000110,_rf,in_stack_00000100,_length,anon_var_0._7_1_,
                          anon_var_0._6_1_), local_58 = in_stack_fffffffffffffee0,
         in_stack_fffffffffffffee0 != (allocator_type *)0x0)) {
        pcVar4 = std::vector<char,_std::allocator<char>_>::data
                           ((vector<char,_std::allocator<char>_> *)0x131f04);
        local_58 = (allocator_type *)
                   GenApi_3_4::FileProtocolAdapter::read
                             ((char *)local_30,(long)pcVar4,(long)local_50,(char *)local_58);
      }
      if (local_58 != (allocator_type *)0x0) {
        pcVar4 = std::vector<char,_std::allocator<char>_>::data
                           ((vector<char,_std::allocator<char>_> *)0x131fa8);
        std::__cxx11::string::append((char *)in_RDI,(ulong)pcVar4);
      }
      local_50 = local_58 + (long)local_50;
    }
    GenApi_3_4::FileProtocolAdapter::closeFile((char *)local_30);
    std::vector<char,_std::allocator<char>_>::~vector
              ((vector<char,_std::allocator<char>_> *)in_stack_fffffffffffffee0);
  }
  local_1a = 1;
  GenApi_3_4::FileProtocolAdapter::~FileProtocolAdapter(local_30);
  if ((local_1a & 1) == 0) {
    std::__cxx11::string::~string(in_RDI);
  }
  return in_RDI;
}

Assistant:

std::string loadFile(const std::shared_ptr<GenApi::CNodeMapRef> &nodemap, const char *name,
                     bool exception)
{
  std::string ret;

  // load file in pieces of 512 bytes

  GenApi::FileProtocolAdapter rf;
  rf.attach(nodemap->_Ptr);

  if (rf.openFile(name, std::ios::in))
  {
    int length=std::numeric_limits<int>::max();
    try
    {
      // limit read operation to file size, if available
      length=rcg::getInteger(nodemap, "FileSize", 0, 0, true);
    }
    catch (const std::exception &)
    { }

    size_t off=0, n=512;
    std::vector<char> buffer(512);

    while (n > 0 && length > 0)
    {
      n=rf.read(buffer.data(), off, std::min(length, static_cast<int>(buffer.size())), name);

      if (n == 0)
      {
        // workaround for reading last partial block if camera reports failure

        n=rcg::getInteger(nodemap, "FileOperationResult");

        if (n > 0)
        {
          n=rf.read(buffer.data(), off, n, name);
        }
      }

      if (n > 0)
      {
        ret.append(buffer.data(), n);
      }

      off+=n;
      length-=n;
    }

    rf.closeFile(name);
  }
  else
  {
    if (exception)
    {
      throw std::invalid_argument(std::string("Cannot open file for reading: ")+name);
    }
  }

  return ret;
}